

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

void __thiscall
crnlib::static_huffman_data_model::~static_huffman_data_model(static_huffman_data_model *this)

{
  if (this->m_pDecode_tables != (decoder_tables *)0x0) {
    crnlib_delete<crnlib::prefix_coding::decoder_tables>(this->m_pDecode_tables);
  }
  vector<unsigned_char>::~vector(&this->m_code_sizes);
  vector<unsigned_short>::~vector(&this->m_codes);
  return;
}

Assistant:

static_huffman_data_model::~static_huffman_data_model()
    {
        if (m_pDecode_tables)
        {
            crnlib_delete(m_pDecode_tables);
        }
    }